

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncpy.c
# Opt level: O0

char * strncpy(char *__dest,char *__src,size_t __n)

{
  char cVar1;
  bool bVar2;
  char *rc;
  size_t n_local;
  char *s2_local;
  char *s1_local;
  
  rc = (char *)__n;
  n_local = (size_t)__src;
  s2_local = __dest;
  while( true ) {
    bVar2 = false;
    if (rc != (char *)0x0) {
      cVar1 = *(char *)n_local;
      *s2_local = cVar1;
      bVar2 = cVar1 != '\0';
      n_local = n_local + 1;
      s2_local = s2_local + 1;
    }
    if (!bVar2) break;
    rc = rc + -1;
  }
  while ((char *)0x1 < rc) {
    *s2_local = '\0';
    rc = rc + -1;
    s2_local = s2_local + 1;
  }
  return __dest;
}

Assistant:

char * strncpy( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2, size_t n )
{
    char * rc = s1;

    while ( n && ( *s1++ = *s2++ ) )
    {
        /* Cannot do "n--" in the conditional as size_t is unsigned and we have
           to check it again for >0 in the next loop below, so we must not risk
           underflow.
        */
        --n;
    }

    /* Checking against 1 as we missed the last --n in the loop above. */
    while ( n-- > 1 )
    {
        *s1++ = '\0';
    }

    return rc;
}